

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThat::mouseReleaseEvent(QWhatsThat *this,QMouseEvent *e)

{
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  QPoint QVar4;
  int __fd;
  QArrayDataPointer<char16_t> *pQVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QWhatsThisClickedEvent e_1;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  QMouseEvent *pQVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->pressed == true) {
    pQVar5 = e;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->widget);
    __fd = (int)pQVar5;
    if (((bVar2) && (*(int *)(e + 0x40) == 1)) && (this->doc != (QTextDocument *)0x0)) {
      local_a8 = (undefined1  [16])QWidget::rect(&this->super_QWidget);
      local_58._0_16_ = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_78.d = (Data *)QPointF::toPoint((QPointF *)&local_58);
      __fd = (int)&local_78;
      cVar3 = QRect::contains((QPoint *)local_a8,SUB81(&local_78,0));
      if (cVar3 != '\0') {
        pQVar6 = &local_58;
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QTextDocument::documentLayout();
        local_78._0_16_ = QSinglePointEvent::position((QSinglePointEvent *)e);
        QVar4 = QPointF::toPoint((QPointF *)&local_78);
        local_a8._8_8_ = (double)(QVar4.yp.m_i.m_i + -8);
        local_a8._0_8_ = (double)(QVar4.xp.m_i.m_i + -0xc);
        QAbstractTextDocumentLayout::anchorAt((QPointF *)pQVar6);
        local_78._0_16_ = ZEXT816(0);
        local_78.size = 0;
        bVar2 = ::comparesEqual(&this->anchor,(QString *)pQVar6);
        __fd = (int)pQVar6;
        if (bVar2) {
          pQVar6 = &local_58;
          QString::operator=((QString *)&local_78,(QString *)pQVar6);
          __fd = (int)pQVar6;
        }
        QString::clear(&this->anchor);
        if (local_78.size != 0) {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QWhatsThisClickedEvent::QWhatsThisClickedEvent
                    ((QWhatsThisClickedEvent *)local_a8,(QString *)&local_78);
          pDVar1 = (this->widget).wp.d;
          if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
            pQVar7 = (QObject *)0x0;
          }
          else {
            pQVar7 = (this->widget).wp.value;
          }
          __fd = (int)local_a8;
          cVar3 = QCoreApplication::sendEvent(pQVar7,(QEvent *)local_a8);
          QWhatsThisClickedEvent::~QWhatsThisClickedEvent((QWhatsThisClickedEvent *)local_a8);
          if (cVar3 != '\0') {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            goto LAB_0038140f;
          }
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
    }
    QWidget::close(&this->super_QWidget,__fd);
  }
LAB_0038140f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseReleaseEvent(QMouseEvent* e)
{
    if (!pressed)
        return;
    if (widget && e->button() == Qt::LeftButton && doc && rect().contains(e->position().toPoint())) {
        QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
        QString href;
        if (anchor == a)
            href = a;
        anchor.clear();
        if (!href.isEmpty()) {
            QWhatsThisClickedEvent e(href);
            if (QCoreApplication::sendEvent(widget, &e))
                return;
        }
    }
    close();
}